

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O1

API<Args::details::API<Args::details::API<Args::CmdLine,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::details::API<Args::CmdLine,Args::OnlyOneGroup,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>,Args::Command,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
::addOnlyOneGroup<char_const(&)[15]>
          (API<Args::details::API<Args::details::API<Args::CmdLine,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
           *__return_storage_ptr__,void *this,char (*name) [15],bool required)

{
  GroupIface *this_00;
  
  this_00 = (GroupIface *)operator_new(0x50);
  GroupIface::GroupIface<char_const(&)[15]>(this_00,name,required);
  (this_00->super_ArgIface)._vptr_ArgIface = (_func_int **)&PTR__GroupIface_001729d8;
  (**(code **)(**(long **)((long)this + 0x10) + 0x98))();
  if (this_00 != (GroupIface *)0x0) {
    (*(this_00->super_ArgIface)._vptr_ArgIface[1])();
  }
  __return_storage_ptr__->_vptr_API = (_func_int **)&PTR__API_00172d28;
  __return_storage_ptr__->m_parent =
       (API<Args::details::API<Args::CmdLine,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
        *)this;
  __return_storage_ptr__->m_self = (OnlyOneGroup *)this_00;
  return __return_storage_ptr__;
}

Assistant:

API< API< PARENT, Command, ARGPTR, false >, OnlyOneGroup, ARGPTR, false > addOnlyOneGroup(
		//! Name of the group.
		NAME && name,
		//! Is group required?
		bool required = false )
	{
		auto group = std::unique_ptr< OnlyOneGroup, details::Deleter< ArgIface > > (
			new OnlyOneGroup( std::forward< NAME > ( name ), required ),
			details::Deleter< ArgIface > ( true ) );

		OnlyOneGroup & g = *group;

		ARGPTR a = std::move( group );

		m_self.addArg( std::move( a ) );

		return API< API< PARENT, Command, ARGPTR, false >, OnlyOneGroup, ARGPTR, false >
			( *this, g );
	}